

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgetfactory.cpp
# Opt level: O1

QAccessibleInterface * qAccessibleFactory(QString *classname,QObject *object)

{
  long lVar1;
  char cVar2;
  QAccessibleAbstractSpinBox *this;
  QAccessibleTable *this_00;
  undefined *puVar3;
  Role RVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QStringView QVar47;
  QStringView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QLatin1String QVar55;
  QLatin1String QVar56;
  QLatin1String QVar57;
  QLatin1String QVar58;
  QLatin1String QVar59;
  QLatin1String QVar60;
  QLatin1String QVar61;
  QLatin1String QVar62;
  QLatin1String QVar63;
  QLatin1String QVar64;
  QLatin1String QVar65;
  QLatin1String QVar66;
  QLatin1String QVar67;
  QLatin1String QVar68;
  QLatin1String QVar69;
  QLatin1String QVar70;
  QLatin1String QVar71;
  QLatin1String QVar72;
  QLatin1String QVar73;
  QLatin1String QVar74;
  QLatin1String QVar75;
  QLatin1String QVar76;
  QLatin1String QVar77;
  QLatin1String QVar78;
  QLatin1String QVar79;
  QLatin1String QVar80;
  QLatin1String QVar81;
  QLatin1String QVar82;
  QLatin1String QVar83;
  QLatin1String QVar84;
  QLatin1String QVar85;
  QLatin1String QVar86;
  QLatin1String QVar87;
  QLatin1String QVar88;
  QLatin1String QVar89;
  QLatin1String QVar90;
  QLatin1String QVar91;
  QLatin1String QVar92;
  QLatin1String QVar93;
  QLatin1String QVar94;
  QLatin1String QVar95;
  QLatin1String QVar96;
  QLatin1String QVar97;
  QLatin1String QVar98;
  QLatin1String QVar99;
  QLatin1String QVar100;
  QLatin1String QVar101;
  QLatin1String QVar102;
  QLatin1String QVar103;
  QLatin1String QVar104;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((object == (QObject *)0x0) || ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) == 0)) ||
     ((*(byte *)(*(long *)(object + 8) + 0x1c2) & 4) != 0)) {
LAB_00525e11:
    this = (QAccessibleAbstractSpinBox *)0x0;
    goto LAB_00525e14;
  }
  lVar1 = (classname->d).size;
  if (lVar1 == 9) {
    QVar5.m_data = (classname->d).ptr;
    QVar5.m_size = 9;
    QVar55.m_data = "QLineEdit";
    QVar55.m_size = 9;
    cVar2 = QtPrivate::equalStrings(QVar5,QVar55);
    if (cVar2 == '\0') {
      QVar7.m_data = (classname->d).ptr;
      QVar7.m_size = 9;
      QVar57.m_data = "QComboBox";
      QVar57.m_size = 9;
      cVar2 = QtPrivate::equalStrings(QVar7,QVar57);
      if (cVar2 != '\0') {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleComboBox::QAccessibleComboBox((QAccessibleComboBox *)this,(QWidget *)object);
        goto LAB_00525e14;
      }
      goto LAB_00525c68;
    }
    QObject::objectName();
    if (local_48.d.size == 0x13) {
      QVar6.m_data = local_48.d.ptr;
      QVar6.m_size = 0x13;
      QVar56.m_data = "qt_spinbox_lineedit";
      QVar56.m_size = 0x13;
      cVar2 = QtPrivate::equalStrings(QVar6,QVar56);
    }
    else {
      cVar2 = '\0';
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (cVar2 != '\0') goto LAB_00525e11;
    this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (storage_type_conflict *)0x0;
    local_48.d.size = 0;
    QAccessibleLineEdit::QAccessibleLineEdit
              ((QAccessibleLineEdit *)this,(QWidget *)object,&local_48);
  }
  else {
LAB_00525c68:
    if ((lVar1 == 0x10) &&
       (QVar8.m_data = (classname->d).ptr, QVar8.m_size = 0x10, QVar58.m_data = "QAbstractSpinBox",
       QVar58.m_size = 0x10, cVar2 = QtPrivate::equalStrings(QVar8,QVar58), cVar2 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
      QAccessibleAbstractSpinBox::QAccessibleAbstractSpinBox(this,(QWidget *)object);
      goto LAB_00525e14;
    }
    if ((lVar1 == 8) &&
       (QVar9.m_data = (classname->d).ptr, QVar9.m_size = 8, QVar59.m_data = "QSpinBox",
       QVar59.m_size = 8, cVar2 = QtPrivate::equalStrings(QVar9,QVar59), cVar2 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
      QAccessibleSpinBox::QAccessibleSpinBox((QAccessibleSpinBox *)this,(QWidget *)object);
      goto LAB_00525e14;
    }
    if ((lVar1 == 0xe) &&
       (QVar10.m_data = (classname->d).ptr, QVar10.m_size = 0xe, QVar60.m_data = "QDoubleSpinBox",
       QVar60.m_size = 0xe, cVar2 = QtPrivate::equalStrings(QVar10,QVar60), cVar2 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
      QAccessibleDoubleSpinBox::QAccessibleDoubleSpinBox
                ((QAccessibleDoubleSpinBox *)this,(QWidget *)object);
      goto LAB_00525e14;
    }
    if ((lVar1 == 10) &&
       (QVar11.m_data = (classname->d).ptr, QVar11.m_size = 10, QVar61.m_data = "QScrollBar",
       QVar61.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar11,QVar61), cVar2 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
      QAccessibleScrollBar::QAccessibleScrollBar((QAccessibleScrollBar *)this,(QWidget *)object);
      goto LAB_00525e14;
    }
    if ((lVar1 == 0xf) &&
       (QVar12.m_data = (classname->d).ptr, QVar12.m_size = 0xf, QVar62.m_data = "QAbstractSlider",
       QVar62.m_size = 0xf, cVar2 = QtPrivate::equalStrings(QVar12,QVar62), cVar2 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
      QAccessibleAbstractSlider::QAccessibleAbstractSlider
                ((QAccessibleAbstractSlider *)this,(QWidget *)object,Slider);
      goto LAB_00525e14;
    }
    if ((lVar1 == 7) &&
       (QVar13.m_data = (classname->d).ptr, QVar13.m_size = 7, QVar63.m_data = "QSlider",
       QVar63.m_size = 7, cVar2 = QtPrivate::equalStrings(QVar13,QVar63), cVar2 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
      QAccessibleSlider::QAccessibleSlider((QAccessibleSlider *)this,(QWidget *)object);
      goto LAB_00525e14;
    }
    if ((lVar1 == 0xb) &&
       (QVar14.m_data = (classname->d).ptr, QVar14.m_size = 0xb, QVar64.m_data = "QToolButton",
       QVar64.m_size = 0xb, cVar2 = QtPrivate::equalStrings(QVar14,QVar64), cVar2 != '\0')) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleToolButton::QAccessibleToolButton((QAccessibleToolButton *)this,(QWidget *)object);
      goto LAB_00525e14;
    }
    if (((((lVar1 == 9) &&
          (QVar15.m_data = (classname->d).ptr, QVar15.m_size = 9, QVar65.m_data = "QCheckBox",
          QVar65.m_size = 9, cVar2 = QtPrivate::equalStrings(QVar15,QVar65), cVar2 != '\0')) ||
         ((lVar1 == 0xc &&
          (QVar16.m_data = (classname->d).ptr, QVar16.m_size = 0xc, QVar66.m_data = "QRadioButton",
          QVar66.m_size = 0xc, cVar2 = QtPrivate::equalStrings(QVar16,QVar66), cVar2 != '\0')))) ||
        ((lVar1 == 0xb &&
         (QVar17.m_data = (classname->d).ptr, QVar17.m_size = 0xb, QVar67.m_data = "QPushButton",
         QVar67.m_size = 0xb, cVar2 = QtPrivate::equalStrings(QVar17,QVar67), cVar2 != '\0')))) ||
       ((lVar1 == 0xf &&
        (QVar18.m_data = (classname->d).ptr, QVar18.m_size = 0xf, QVar68.m_data = "QAbstractButton",
        QVar68.m_size = 0xf, cVar2 = QtPrivate::equalStrings(QVar18,QVar68), cVar2 != '\0')))) {
      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
      QAccessibleButton::QAccessibleButton((QAccessibleButton *)this,(QWidget *)object);
      goto LAB_00525e14;
    }
    if ((lVar1 != 7) ||
       (QVar19.m_data = (classname->d).ptr, QVar19.m_size = 7, QVar69.m_data = "QDialog",
       QVar69.m_size = 7, cVar2 = QtPrivate::equalStrings(QVar19,QVar69), cVar2 == '\0')) {
      if (lVar1 == 0xb) {
        QVar20.m_data = (classname->d).ptr;
        QVar20.m_size = 0xb;
        QVar70.m_data = "QMessageBox";
        QVar70.m_size = 0xb;
        cVar2 = QtPrivate::equalStrings(QVar20,QVar70);
        if (cVar2 != '\0') {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          QAccessibleMessageBox::QAccessibleMessageBox
                    ((QAccessibleMessageBox *)this,(QWidget *)object);
          goto LAB_00525e14;
        }
        QVar21.m_data = (classname->d).ptr;
        QVar21.m_size = 0xb;
        QVar71.m_data = "QMainWindow";
        QVar71.m_size = 0xb;
        cVar2 = QtPrivate::equalStrings(QVar21,QVar71);
        if (cVar2 != '\0') {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          QAccessibleMainWindow::QAccessibleMainWindow
                    ((QAccessibleMainWindow *)this,(QWidget *)object);
          goto LAB_00525e14;
        }
      }
      if (((lVar1 == 6) &&
          (QVar22.m_data = (classname->d).ptr, QVar22.m_size = 6, QVar72.m_data = "QLabel",
          QVar72.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar22,QVar72), cVar2 != '\0')) ||
         ((lVar1 == 10 &&
          (QVar23.m_data = (classname->d).ptr, QVar23.m_size = 10, QVar73.m_data = "QLCDNumber",
          QVar73.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar23,QVar73), cVar2 != '\0')))) {
LAB_005260e9:
        this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
        RVar4 = StaticText;
LAB_00526101:
        QAccessibleDisplay::QAccessibleDisplay((QAccessibleDisplay *)this,(QWidget *)object,RVar4);
        goto LAB_00525e14;
      }
      if ((lVar1 == 9) &&
         (QVar24.m_data = (classname->d).ptr, QVar24.m_size = 9, QVar74.m_data = "QGroupBox",
         QVar74.m_size = 9, cVar2 = QtPrivate::equalStrings(QVar24,QVar74), cVar2 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleGroupBox::QAccessibleGroupBox((QAccessibleGroupBox *)this,(QWidget *)object);
        goto LAB_00525e14;
      }
      if ((lVar1 == 10) &&
         (QVar25.m_data = (classname->d).ptr, QVar25.m_size = 10, QVar75.m_data = "QStatusBar",
         QVar75.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar25,QVar75), cVar2 != '\0'))
      goto LAB_005260e9;
      if ((lVar1 == 0xc) &&
         (QVar26.m_data = (classname->d).ptr, QVar26.m_size = 0xc, QVar76.m_data = "QProgressBar",
         QVar76.m_size = 0xc, cVar2 = QtPrivate::equalStrings(QVar26,QVar76), cVar2 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
        QAccessibleProgressBar::QAccessibleProgressBar
                  ((QAccessibleProgressBar *)this,(QWidget *)object);
        goto LAB_00525e14;
      }
      if (lVar1 == 8) {
        QVar27.m_data = (classname->d).ptr;
        QVar27.m_size = 8;
        QVar77.m_data = "QToolBar";
        QVar77.m_size = 8;
        cVar2 = QtPrivate::equalStrings(QVar27,QVar77);
        if (cVar2 != '\0') {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          QWidget::windowTitle(&local_48,(QWidget *)object);
          RVar4 = ToolBar;
          goto LAB_00525fb5;
        }
        QVar28.m_data = (classname->d).ptr;
        QVar28.m_size = 8;
        QVar78.m_data = "QMenuBar";
        QVar78.m_size = 8;
        cVar2 = QtPrivate::equalStrings(QVar28,QVar78);
        if (cVar2 != '\0') {
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          QAccessibleMenuBar::QAccessibleMenuBar((QAccessibleMenuBar *)this,(QWidget *)object);
          goto LAB_00525e14;
        }
      }
      if ((lVar1 == 5) &&
         (QVar29.m_data = (classname->d).ptr, QVar29.m_size = 5, QVar79.m_data = "QMenu",
         QVar79.m_size = 5, cVar2 = QtPrivate::equalStrings(QVar29,QVar79), cVar2 != '\0')) {
        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
        QAccessibleMenu::QAccessibleMenu((QAccessibleMenu *)this,(QWidget *)object);
        goto LAB_00525e14;
      }
      if (lVar1 == 9) {
        QVar30.m_data = (classname->d).ptr;
        QVar30.m_size = 9;
        QVar80.m_data = "QTreeView";
        QVar80.m_size = 9;
        cVar2 = QtPrivate::equalStrings(QVar30,QVar80);
        if (cVar2 == '\0') {
          QVar31.m_data = (classname->d).ptr;
          QVar31.m_size = 9;
          QVar81.m_data = "QListView";
          QVar81.m_size = 9;
          cVar2 = QtPrivate::equalStrings(QVar31,QVar81);
          if (cVar2 == '\0') goto LAB_005262bf;
          this_00 = (QAccessibleTable *)operator_new(0x30);
          QAccessibleTable::QAccessibleTable(this_00,(QWidget *)object);
          puVar3 = &QAccessibleList::vtable;
        }
        else {
          this_00 = (QAccessibleTable *)operator_new(0x30);
          QAccessibleTable::QAccessibleTable(this_00,(QWidget *)object);
          puVar3 = &QAccessibleTree::vtable;
        }
        *(undefined **)this_00 = puVar3 + 0x10;
        *(undefined **)&this_00->super_QAccessibleSelectionInterface = puVar3 + 0x168;
        *(undefined **)&this_00->super_QAccessibleObject = puVar3 + 0x1c8;
      }
      else {
LAB_005262bf:
        if ((lVar1 != 10) ||
           (QVar32.m_data = (classname->d).ptr, QVar32.m_size = 10, QVar82.m_data = "QTableView",
           QVar82.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar32,QVar82), cVar2 == '\0')) {
          if ((lVar1 == 7) &&
             (QVar33.m_data = (classname->d).ptr, QVar33.m_size = 7, QVar83.m_data = "QTabBar",
             QVar83.m_size = 7, cVar2 = QtPrivate::equalStrings(QVar33,QVar83), cVar2 != '\0')) {
            this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
            QAccessibleTabBar::QAccessibleTabBar((QAccessibleTabBar *)this,(QWidget *)object);
            goto LAB_00525e14;
          }
          if (lVar1 == 9) {
            QVar34.m_data = (classname->d).ptr;
            QVar34.m_size = 9;
            QVar84.m_data = "QSizeGrip";
            QVar84.m_size = 9;
            cVar2 = QtPrivate::equalStrings(QVar34,QVar84);
            if (cVar2 == '\0') {
              QVar35.m_data = (classname->d).ptr;
              QVar35.m_size = 9;
              QVar85.m_data = "QSplitter";
              QVar85.m_size = 9;
              cVar2 = QtPrivate::equalStrings(QVar35,QVar85);
              if (cVar2 != '\0') {
                this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                local_48.d.d = (Data *)0x0;
                local_48.d.ptr = (storage_type_conflict *)0x0;
                local_48.d.size = 0;
                RVar4 = Splitter;
                goto LAB_00525fb5;
              }
              goto LAB_005263b4;
            }
          }
          else {
LAB_005263b4:
            if ((lVar1 != 0xf) ||
               (QVar36.m_data = (classname->d).ptr, QVar36.m_size = 0xf,
               QVar86.m_data = "QSplitterHandle", QVar86.m_size = 0xf,
               cVar2 = QtPrivate::equalStrings(QVar36,QVar86), cVar2 == '\0')) {
              if ((lVar1 == 9) &&
                 (QVar37.m_data = (classname->d).ptr, QVar37.m_size = 9, QVar87.m_data = "QTextEdit"
                 , QVar87.m_size = 9, cVar2 = QtPrivate::equalStrings(QVar37,QVar87), cVar2 != '\0')
                 ) {
                this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
                QAccessibleTextEdit::QAccessibleTextEdit
                          ((QAccessibleTextEdit *)this,(QWidget *)object);
                goto LAB_00525e14;
              }
              if ((lVar1 == 0xe) &&
                 (QVar38.m_data = (classname->d).ptr, QVar38.m_size = 0xe,
                 QVar88.m_data = "QPlainTextEdit", QVar88.m_size = 0xe,
                 cVar2 = QtPrivate::equalStrings(QVar38,QVar88), cVar2 != '\0')) {
                this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
                QAccessiblePlainTextEdit::QAccessiblePlainTextEdit
                          ((QAccessiblePlainTextEdit *)this,(QWidget *)object);
                goto LAB_00525e14;
              }
              if ((lVar1 != 9) ||
                 (QVar39.m_data = (classname->d).ptr, QVar39.m_size = 9, QVar89.m_data = "QTipLabel"
                 , QVar89.m_size = 9, cVar2 = QtPrivate::equalStrings(QVar39,QVar89), cVar2 == '\0')
                 ) {
                if ((lVar1 != 6) ||
                   (QVar40.m_data = (classname->d).ptr, QVar40.m_size = 6, QVar90.m_data = "QFrame",
                   QVar90.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar40,QVar90), cVar2 == '\0')
                   ) {
                  if ((lVar1 == 0xe) &&
                     (QVar41.m_data = (classname->d).ptr, QVar41.m_size = 0xe,
                     QVar91.m_data = "QStackedWidget", QVar91.m_size = 0xe,
                     cVar2 = QtPrivate::equalStrings(QVar41,QVar91), cVar2 != '\0')) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    QAccessibleStackedWidget::QAccessibleStackedWidget
                              ((QAccessibleStackedWidget *)this,(QWidget *)object);
                    goto LAB_00525e14;
                  }
                  if (lVar1 == 8) {
                    QVar42.m_data = (classname->d).ptr;
                    QVar42.m_size = 8;
                    QVar92.m_data = "QToolBox";
                    QVar92.m_size = 8;
                    cVar2 = QtPrivate::equalStrings(QVar42,QVar92);
                    if (cVar2 != '\0') {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                      QAccessibleToolBox::QAccessibleToolBox
                                ((QAccessibleToolBox *)this,(QWidget *)object);
                      goto LAB_00525e14;
                    }
                    QVar43.m_data = (classname->d).ptr;
                    QVar43.m_size = 8;
                    QVar93.m_data = "QMdiArea";
                    QVar93.m_size = 8;
                    cVar2 = QtPrivate::equalStrings(QVar43,QVar93);
                    if (cVar2 != '\0') {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                      QAccessibleMdiArea::QAccessibleMdiArea
                                ((QAccessibleMdiArea *)this,(QWidget *)object);
                      goto LAB_00525e14;
                    }
                  }
                  if ((lVar1 == 0xd) &&
                     (QVar44.m_data = (classname->d).ptr, QVar44.m_size = 0xd,
                     QVar94.m_data = "QMdiSubWindow", QVar94.m_size = 0xd,
                     cVar2 = QtPrivate::equalStrings(QVar44,QVar94), cVar2 != '\0')) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    QAccessibleMdiSubWindow::QAccessibleMdiSubWindow
                              ((QAccessibleMdiSubWindow *)this,(QWidget *)object);
                    goto LAB_00525e14;
                  }
                  if ((lVar1 == 0x10) &&
                     (QVar45.m_data = (classname->d).ptr, QVar45.m_size = 0x10,
                     QVar95.m_data = "QDialogButtonBox", QVar95.m_size = 0x10,
                     cVar2 = QtPrivate::equalStrings(QVar45,QVar95), cVar2 != '\0')) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    QAccessibleDialogButtonBox::QAccessibleDialogButtonBox
                              ((QAccessibleDialogButtonBox *)this,(QWidget *)object);
                    goto LAB_00525e14;
                  }
                  if ((lVar1 == 5) &&
                     (QVar46.m_data = (classname->d).ptr, QVar46.m_size = 5, QVar96.m_data = "QDial"
                     , QVar96.m_size = 5, cVar2 = QtPrivate::equalStrings(QVar46,QVar96),
                     cVar2 != '\0')) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
                    QAccessibleDial::QAccessibleDial((QAccessibleDial *)this,(QWidget *)object);
                    goto LAB_00525e14;
                  }
                  if ((lVar1 != 0xb) ||
                     (QVar47.m_data = (classname->d).ptr, QVar47.m_size = 0xb,
                     QVar97.m_data = "QRubberBand", QVar97.m_size = 0xb,
                     cVar2 = QtPrivate::equalStrings(QVar47,QVar97), cVar2 == '\0')) {
                    if ((lVar1 == 0xc) &&
                       (QVar48.m_data = (classname->d).ptr, QVar48.m_size = 0xc,
                       QVar98.m_data = "QTextBrowser", QVar98.m_size = 0xc,
                       cVar2 = QtPrivate::equalStrings(QVar48,QVar98), cVar2 != '\0')) {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
                      QAccessibleTextBrowser::QAccessibleTextBrowser
                                ((QAccessibleTextBrowser *)this,(QWidget *)object);
                      goto LAB_00525e14;
                    }
                    if ((lVar1 == 0x13) &&
                       (QVar49.m_data = (classname->d).ptr, QVar49.m_size = 0x13,
                       QVar99.m_data = "QAbstractScrollArea", QVar99.m_size = 0x13,
                       cVar2 = QtPrivate::equalStrings(QVar49,QVar99), cVar2 != '\0')) {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                      QAccessibleAbstractScrollArea::QAccessibleAbstractScrollArea
                                ((QAccessibleAbstractScrollArea *)this,(QWidget *)object);
                      goto LAB_00525e14;
                    }
                    if ((lVar1 == 0xb) &&
                       (QVar50.m_data = (classname->d).ptr, QVar50.m_size = 0xb,
                       QVar100.m_data = "QScrollArea", QVar100.m_size = 0xb,
                       cVar2 = QtPrivate::equalStrings(QVar50,QVar100), cVar2 != '\0')) {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                      QAccessibleScrollArea::QAccessibleScrollArea
                                ((QAccessibleScrollArea *)this,(QWidget *)object);
                      goto LAB_00525e14;
                    }
                    if ((lVar1 == 0xf) &&
                       (QVar51.m_data = (classname->d).ptr, QVar51.m_size = 0xf,
                       QVar101.m_data = "QCalendarWidget", QVar101.m_size = 0xf,
                       cVar2 = QtPrivate::equalStrings(QVar51,QVar101), cVar2 != '\0')) {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                      QAccessibleCalendarWidget::QAccessibleCalendarWidget
                                ((QAccessibleCalendarWidget *)this,(QWidget *)object);
                      goto LAB_00525e14;
                    }
                    if ((lVar1 == 0xb) &&
                       (QVar52.m_data = (classname->d).ptr, QVar52.m_size = 0xb,
                       QVar102.m_data = "QDockWidget", QVar102.m_size = 0xb,
                       cVar2 = QtPrivate::equalStrings(QVar52,QVar102), cVar2 != '\0')) {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                      QAccessibleDockWidget::QAccessibleDockWidget
                                ((QAccessibleDockWidget *)this,(QWidget *)object);
                      goto LAB_00525e14;
                    }
                    if ((lVar1 != 7) ||
                       (QVar53.m_data = (classname->d).ptr, QVar53.m_size = 7,
                       QVar103.m_data = "QWidget", QVar103.m_size = 7,
                       cVar2 = QtPrivate::equalStrings(QVar53,QVar103), cVar2 == '\0')) {
                      if ((lVar1 == 0x10) &&
                         (QVar54.m_data = (classname->d).ptr, QVar54.m_size = 0x10,
                         QVar104.m_data = "QWindowContainer", QVar104.m_size = 0x10,
                         cVar2 = QtPrivate::equalStrings(QVar54,QVar104), cVar2 != '\0')) {
                        this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                        QAccessibleWindowContainer::QAccessibleWindowContainer
                                  ((QAccessibleWindowContainer *)this,(QWidget *)object);
                        goto LAB_00525e14;
                      }
                      goto LAB_00525e11;
                    }
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    local_48.d.d = (Data *)0x0;
                    local_48.d.ptr = (storage_type_conflict *)0x0;
                    local_48.d.size = 0;
                    RVar4 = Client;
                    goto LAB_00525fb5;
                  }
                }
                this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                local_48.d.d = (Data *)0x0;
                local_48.d.ptr = (storage_type_conflict *)0x0;
                local_48.d.size = 0;
                RVar4 = Border;
                goto LAB_00525fb5;
              }
              this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
              RVar4 = ToolTip;
              goto LAB_00526101;
            }
          }
          this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
          local_48.d.d = (Data *)0x0;
          local_48.d.ptr = (storage_type_conflict *)0x0;
          local_48.d.size = 0;
          RVar4 = Grip;
          goto LAB_00525fb5;
        }
        this_00 = (QAccessibleTable *)operator_new(0x30);
        QAccessibleTable::QAccessibleTable(this_00,(QWidget *)object);
      }
      this = (QAccessibleAbstractSpinBox *)&this_00->super_QAccessibleObject;
      goto LAB_00525e14;
    }
    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (storage_type_conflict *)0x0;
    local_48.d.size = 0;
    RVar4 = Dialog;
LAB_00525fb5:
    QAccessibleWidget::QAccessibleWidget
              (&this->super_QAccessibleWidget,(QWidget *)object,RVar4,&local_48);
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00525e14:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (QAccessibleInterface *)this;
}

Assistant:

QAccessibleInterface *qAccessibleFactory(const QString &classname, QObject *object)
{
    QAccessibleInterface *iface = nullptr;
    if (!object || !object->isWidgetType())
        return iface;

    QWidget *widget = static_cast<QWidget*>(object);
    // QWidget emits destroyed() from its destructor instead of letting the QObject
    // destructor do it, which means the QWidget is unregistered from the accessibillity
    // cache. But QWidget destruction also emits enter and leave events, which may end
    // up here, so we have to ensure that we don't fill the cache with an entry of
    // a widget that is going away.
    if (QWidgetPrivate::get(widget)->data.in_destructor)
        return iface;

    if (false) {
#if QT_CONFIG(lineedit)
    } else if (classname == "QLineEdit"_L1) {
        if (widget->objectName() == "qt_spinbox_lineedit"_L1)
            iface = nullptr;
        else
            iface = new QAccessibleLineEdit(widget);
#endif
#if QT_CONFIG(combobox)
    } else if (classname == "QComboBox"_L1) {
        iface = new QAccessibleComboBox(widget);
#endif
#if QT_CONFIG(spinbox)
    } else if (classname == "QAbstractSpinBox"_L1) {
        iface = new QAccessibleAbstractSpinBox(widget);
    } else if (classname == "QSpinBox"_L1) {
        iface = new QAccessibleSpinBox(widget);
    } else if (classname == "QDoubleSpinBox"_L1) {
        iface = new QAccessibleDoubleSpinBox(widget);
#endif
#if QT_CONFIG(scrollbar)
    } else if (classname == "QScrollBar"_L1) {
        iface = new QAccessibleScrollBar(widget);
#endif
#if QT_CONFIG(slider)
    } else if (classname == "QAbstractSlider"_L1) {
        iface = new QAccessibleAbstractSlider(widget);
    } else if (classname == "QSlider"_L1) {
        iface = new QAccessibleSlider(widget);
#endif
#if QT_CONFIG(toolbutton)
    } else if (classname == "QToolButton"_L1) {
        iface = new QAccessibleToolButton(widget);
#endif // QT_CONFIG(toolbutton)
#if QT_CONFIG(abstractbutton)
    } else if (classname == "QCheckBox"_L1
            || classname == "QRadioButton"_L1
            || classname == "QPushButton"_L1
            || classname == "QAbstractButton"_L1) {
        iface = new QAccessibleButton(widget);
#endif
    } else if (classname == "QDialog"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Dialog);
#if QT_CONFIG(messagebox)
    } else if (classname == "QMessageBox"_L1) {
        iface = new QAccessibleMessageBox(widget);
#endif
#if QT_CONFIG(mainwindow)
    } else if (classname == "QMainWindow"_L1) {
        iface = new QAccessibleMainWindow(widget);
#endif
    } else if (classname == "QLabel"_L1 || classname == "QLCDNumber"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(groupbox)
    } else if (classname == "QGroupBox"_L1) {
        iface = new QAccessibleGroupBox(widget);
#endif
    } else if (classname == "QStatusBar"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(progressbar)
    } else if (classname == "QProgressBar"_L1) {
        iface = new QAccessibleProgressBar(widget);
#endif
    } else if (classname == "QToolBar"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::ToolBar, widget->windowTitle());
#if QT_CONFIG(menubar)
    } else if (classname == "QMenuBar"_L1) {
        iface = new QAccessibleMenuBar(widget);
#endif
#if QT_CONFIG(menu)
    } else if (classname == "QMenu"_L1) {
        iface = new QAccessibleMenu(widget);
#endif
#if QT_CONFIG(treeview)
    } else if (classname == "QTreeView"_L1) {
        iface = new QAccessibleTree(widget);
#endif // QT_CONFIG(treeview)
#if QT_CONFIG(listview)
    } else if (classname == "QListView"_L1) {
        iface = new QAccessibleList(widget);
#endif
#if QT_CONFIG(itemviews)
    } else if (classname == "QTableView"_L1) {
        iface = new QAccessibleTable(widget);
#endif // QT_CONFIG(itemviews)
#if QT_CONFIG(tabbar)
    } else if (classname == "QTabBar"_L1) {
        iface = new QAccessibleTabBar(widget);
#endif
    } else if (classname == "QSizeGrip"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#if QT_CONFIG(splitter)
    } else if (classname == "QSplitter"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Splitter);
    } else if (classname == "QSplitterHandle"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#endif
#if QT_CONFIG(textedit) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextEdit"_L1) {
        iface = new QAccessibleTextEdit(widget);
    } else if (classname == "QPlainTextEdit"_L1) {
        iface = new QAccessiblePlainTextEdit(widget);
#endif
    } else if (classname == "QTipLabel"_L1) {
        iface = new QAccessibleDisplay(widget, QAccessible::ToolTip);
    } else if (classname == "QFrame"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#if QT_CONFIG(stackedwidget)
    } else if (classname == "QStackedWidget"_L1) {
        iface = new QAccessibleStackedWidget(widget);
#endif
#if QT_CONFIG(toolbox)
    } else if (classname == "QToolBox"_L1) {
        iface = new QAccessibleToolBox(widget);
#endif
#if QT_CONFIG(mdiarea)
    } else if (classname == "QMdiArea"_L1) {
        iface = new QAccessibleMdiArea(widget);
    } else if (classname == "QMdiSubWindow"_L1) {
        iface = new QAccessibleMdiSubWindow(widget);
#endif
#if QT_CONFIG(dialogbuttonbox)
    } else if (classname == "QDialogButtonBox"_L1) {
        iface = new QAccessibleDialogButtonBox(widget);
#endif
#if QT_CONFIG(dial)
    } else if (classname == "QDial"_L1) {
        iface = new QAccessibleDial(widget);
#endif
#if QT_CONFIG(rubberband)
    } else if (classname == "QRubberBand"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#endif
#if QT_CONFIG(textbrowser) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextBrowser"_L1) {
        iface = new QAccessibleTextBrowser(widget);
#endif
#if QT_CONFIG(scrollarea)
    } else if (classname == "QAbstractScrollArea"_L1) {
        iface = new QAccessibleAbstractScrollArea(widget);
    } else if (classname == "QScrollArea"_L1) {
        iface = new QAccessibleScrollArea(widget);
#endif
#if QT_CONFIG(calendarwidget)
    } else if (classname == "QCalendarWidget"_L1) {
        iface = new QAccessibleCalendarWidget(widget);
#endif
#if QT_CONFIG(dockwidget)
    } else if (classname == "QDockWidget"_L1) {
        iface = new QAccessibleDockWidget(widget);
#endif

    } else if (classname == "QWidget"_L1) {
        iface = new QAccessibleWidget(widget);
    } else if (classname == "QWindowContainer"_L1) {
        iface = new QAccessibleWindowContainer(widget);
    }

    return iface;
}